

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fInfoLogQueryShared.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::verifyInfoLogQuery
          (Functional *this,ResultCollector *result,CallLogWrapper *gl,int logLen,GLuint object,
          offset_in_CallLogWrapper_to_subr getInfoLog,char *getterName)

{
  TestLog *pTVar1;
  int iVar2;
  long lVar3;
  GLenum GVar4;
  size_t sVar5;
  code *pcVar6;
  int iVar7;
  char cVar8;
  undefined4 in_register_00000084;
  code *pcVar9;
  allocator<char> local_131;
  string local_130;
  int written;
  ScopedLogSection section;
  string buf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long *local_90;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  long local_48;
  code *local_40;
  GLenum local_38;
  
  pcVar9 = (code *)CONCAT44(in_register_00000084,object);
  pTVar1 = (TestLog *)(result->m_prefix)._M_dataplus._M_p;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"QueryAll",(allocator<char> *)&local_d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"Query all",(allocator<char> *)&local_b0);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,&buf,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&buf);
  iVar2 = (int)gl;
  iVar7 = iVar2 + 2;
  local_48 = (long)iVar7;
  buf._M_dataplus._M_p = (pointer)&buf.field_2;
  std::__cxx11::string::_M_construct((ulong)&buf,(char)iVar7);
  buf._M_dataplus._M_p[iVar2 + 1] = '\0';
  local_90 = (long *)((long)&result->m_log + getInfoLog);
  pcVar6 = pcVar9;
  if ((object & 1) != 0) {
    pcVar6 = *(code **)(pcVar9 + *local_90 + -1);
  }
  (*pcVar6)(local_90,logLen,(ulong)gl & 0xffffffff,0,buf._M_dataplus._M_p);
  GVar4 = glu::CallLogWrapper::glGetError((CallLogWrapper *)result);
  if (GVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"Got Error ",(allocator<char> *)&written);
    local_40 = glu::getErrorName;
    local_38 = GVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_88,&local_40);
    std::operator+(&local_b0,&local_68,&local_88);
    std::operator+(&local_d0,&local_b0,": ");
    std::operator+(&local_130,&local_d0,getterName);
    tcu::ResultCollector::fail((ResultCollector *)this,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
  }
  if ((iVar2 < 1) || (buf._M_dataplus._M_p[((ulong)gl & 0xffffffff) - 1] == '\0')) {
    if ((buf._M_dataplus._M_p[iVar2] != 'X') && (buf._M_dataplus._M_p[iVar2 + 1] != '\0')) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_130,
                 "Buffer end guard modified, query wrote over the end of the buffer.",
                 (allocator<char> *)&local_d0);
      tcu::ResultCollector::fail((ResultCollector *)this,&local_130);
      goto LAB_012c63ed;
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,
               "Return buffer was not INFO_LOG_LENGTH sized and null-terminated",
               (allocator<char> *)&local_d0);
    tcu::ResultCollector::fail((ResultCollector *)this,&local_130);
LAB_012c63ed:
    std::__cxx11::string::~string((string *)&local_130);
  }
  std::__cxx11::string::~string((string *)&buf);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar1 = (TestLog *)(result->m_prefix)._M_dataplus._M_p;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"QueryMore",(allocator<char> *)&local_d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"Query more",(allocator<char> *)&local_b0);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,&buf,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&buf);
  buf._M_dataplus._M_p = (pointer)&buf.field_2;
  std::__cxx11::string::_M_construct((ulong)&buf,(char)gl + '\x04');
  written = -1;
  buf._M_dataplus._M_p[iVar2 + 3] = '\0';
  pcVar6 = pcVar9;
  if ((object & 1) != 0) {
    pcVar6 = *(code **)(pcVar9 + *local_90 + -1);
  }
  (*pcVar6)(local_90,logLen,iVar7,&written,buf._M_dataplus._M_p);
  GVar4 = glu::CallLogWrapper::glGetError((CallLogWrapper *)result);
  if (GVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"Got Error ",&local_131);
    local_40 = glu::getErrorName;
    local_38 = GVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_88,&local_40);
    std::operator+(&local_b0,&local_68,&local_88);
    std::operator+(&local_d0,&local_b0,": ");
    std::operator+(&local_130,&local_d0,getterName);
    tcu::ResultCollector::fail((ResultCollector *)this,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
  }
  iVar7 = written;
  if ((long)written == -1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,"\'length\' was not written to",(allocator<char> *)&local_d0);
    tcu::ResultCollector::fail((ResultCollector *)this,&local_130);
LAB_012c66e2:
    std::__cxx11::string::~string((string *)&local_130);
  }
  else {
    if (buf._M_dataplus._M_p[written] != '\0') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_130,
                 "Either length was incorrect or result was not null-terminated",
                 (allocator<char> *)&local_d0);
      tcu::ResultCollector::fail((ResultCollector *)this,&local_130);
      goto LAB_012c66e2;
    }
    if ((iVar2 != 0) && (iVar2 < written + 1)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_130,
                 "\'length\' characters + null terminator is larger than INFO_LOG_LENGTH",
                 (allocator<char> *)&local_d0);
      tcu::ResultCollector::fail((ResultCollector *)this,&local_130);
      goto LAB_012c66e2;
    }
    if (written + 1 < iVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_130,"\'length\' is not consistent with INFO_LOG_LENGTH",
                 (allocator<char> *)&local_d0);
      tcu::ResultCollector::fail((ResultCollector *)this,&local_130);
      goto LAB_012c66e2;
    }
    if ((buf._M_dataplus._M_p[local_48] != 'X') && (buf._M_dataplus._M_p[iVar2 + 3] != '\0')) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_130,
                 "Buffer end guard modified, query wrote over the end of the buffer.",
                 (allocator<char> *)&local_d0);
      tcu::ResultCollector::fail((ResultCollector *)this,&local_130);
      goto LAB_012c66e2;
    }
    sVar5 = strlen(buf._M_dataplus._M_p);
    if (iVar7 != (int)sVar5) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_130,"\'length\' and written string length do not match",
                 (allocator<char> *)&local_d0);
      tcu::ResultCollector::fail((ResultCollector *)this,&local_130);
      goto LAB_012c66e2;
    }
  }
  std::__cxx11::string::~string((string *)&buf);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  if (iVar2 < 3) {
    cVar8 = (char)local_48;
    if (0 < iVar2) goto LAB_012c6966;
  }
  else {
    pTVar1 = (TestLog *)(result->m_prefix)._M_dataplus._M_p;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&buf,"QueryLess",(allocator<char> *)&local_d0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,"Query less",(allocator<char> *)&local_b0);
    lVar3 = local_48;
    tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,&buf,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&buf);
    cVar8 = (char)lVar3;
    buf._M_dataplus._M_p = (pointer)&buf.field_2;
    std::__cxx11::string::_M_construct((ulong)&buf,cVar8);
    written = -1;
    pcVar6 = pcVar9;
    if ((object & 1) != 0) {
      pcVar6 = *(code **)(pcVar9 + *local_90 + -1);
    }
    (*pcVar6)(local_90,logLen,2,&written,buf._M_dataplus._M_p);
    GVar4 = glu::CallLogWrapper::glGetError((CallLogWrapper *)result);
    if (GVar4 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"Got Error ",&local_131);
      local_40 = glu::getErrorName;
      local_38 = GVar4;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_88,&local_40);
      std::operator+(&local_b0,&local_68,&local_88);
      std::operator+(&local_d0,&local_b0,": ");
      std::operator+(&local_130,&local_d0,getterName);
      tcu::ResultCollector::fail((ResultCollector *)this,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_68);
    }
    if (written == 1) {
      if (buf._M_dataplus._M_p[1] != '\0') {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_130,"Expected null terminator at index 1",
                   (allocator<char> *)&local_d0);
        tcu::ResultCollector::fail((ResultCollector *)this,&local_130);
        goto LAB_012c6948;
      }
    }
    else {
      if (written == -1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_130,"\'length\' was not written to",(allocator<char> *)&local_d0
                  );
        tcu::ResultCollector::fail((ResultCollector *)this,&local_130);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_130,"Expected \'length\' = 1",(allocator<char> *)&local_d0);
        tcu::ResultCollector::fail((ResultCollector *)this,&local_130);
      }
LAB_012c6948:
      std::__cxx11::string::~string((string *)&local_130);
    }
    std::__cxx11::string::~string((string *)&buf);
    tcu::ScopedLogSection::~ScopedLogSection(&section);
LAB_012c6966:
    pTVar1 = (TestLog *)(result->m_prefix)._M_dataplus._M_p;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&buf,"QueryOne",(allocator<char> *)&local_d0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,"Query one character",(allocator<char> *)&local_b0);
    tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,&buf,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&buf);
    buf._M_dataplus._M_p = (pointer)&buf.field_2;
    std::__cxx11::string::_M_construct((ulong)&buf,cVar8);
    written = -1;
    pcVar6 = pcVar9;
    if ((object & 1) != 0) {
      pcVar6 = *(code **)(pcVar9 + *local_90 + -1);
    }
    (*pcVar6)(local_90,logLen,1,&written,buf._M_dataplus._M_p);
    GVar4 = glu::CallLogWrapper::glGetError((CallLogWrapper *)result);
    if (GVar4 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"Got Error ",&local_131);
      local_40 = glu::getErrorName;
      local_38 = GVar4;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_88,&local_40);
      std::operator+(&local_b0,&local_68,&local_88);
      std::operator+(&local_d0,&local_b0,": ");
      std::operator+(&local_130,&local_d0,getterName);
      tcu::ResultCollector::fail((ResultCollector *)this,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_68);
    }
    if (written == 0) {
      if (*buf._M_dataplus._M_p != '\0') {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_130,"Expected null terminator at index 0",
                   (allocator<char> *)&local_d0);
        tcu::ResultCollector::fail((ResultCollector *)this,&local_130);
        goto LAB_012c6b7a;
      }
    }
    else {
      if (written == -1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_130,"\'length\' was not written to",(allocator<char> *)&local_d0
                  );
        tcu::ResultCollector::fail((ResultCollector *)this,&local_130);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_130,"Expected \'length\' = 0",(allocator<char> *)&local_d0);
        tcu::ResultCollector::fail((ResultCollector *)this,&local_130);
      }
LAB_012c6b7a:
      std::__cxx11::string::~string((string *)&local_130);
    }
    std::__cxx11::string::~string((string *)&buf);
    tcu::ScopedLogSection::~ScopedLogSection(&section);
  }
  pTVar1 = (TestLog *)(result->m_prefix)._M_dataplus._M_p;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"QueryNone",(allocator<char> *)&local_d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"Query to zero-sized buffer",(allocator<char> *)&local_b0);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,&buf,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&buf);
  buf._M_dataplus._M_p = (pointer)&buf.field_2;
  std::__cxx11::string::_M_construct((ulong)&buf,cVar8);
  written = -1;
  if ((object & 1) != 0) {
    pcVar9 = *(code **)(pcVar9 + *local_90 + -1);
  }
  (*pcVar9)(local_90,logLen,0,&written,buf._M_dataplus._M_p);
  GVar4 = glu::CallLogWrapper::glGetError((CallLogWrapper *)result);
  if (GVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"Got Error ",&local_131);
    local_40 = glu::getErrorName;
    local_38 = GVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_88,&local_40);
    std::operator+(&local_b0,&local_68,&local_88);
    std::operator+(&local_d0,&local_b0,": ");
    std::operator+(&local_130,&local_d0,getterName);
    tcu::ResultCollector::fail((ResultCollector *)this,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
  }
  if (written == 0) {
    if (*buf._M_dataplus._M_p == 'X') goto LAB_012c6db1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,"Unexpected buffer mutation at index 0",
               (allocator<char> *)&local_d0);
    tcu::ResultCollector::fail((ResultCollector *)this,&local_130);
  }
  else if (written == -1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,"\'length\' was not written to",(allocator<char> *)&local_d0);
    tcu::ResultCollector::fail((ResultCollector *)this,&local_130);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,"Expected \'length\' = 0",(allocator<char> *)&local_d0);
    tcu::ResultCollector::fail((ResultCollector *)this,&local_130);
  }
  std::__cxx11::string::~string((string *)&local_130);
LAB_012c6db1:
  std::__cxx11::string::~string((string *)&buf);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  return;
}

Assistant:

void verifyInfoLogQuery (tcu::ResultCollector&			result,
						 glu::CallLogWrapper&			gl,
						 int							logLen,
						 glw::GLuint					object,
						 void (glu::CallLogWrapper::*	getInfoLog)(glw::GLuint, glw::GLsizei, glw::GLsizei*, glw::GLchar*),
						 const char*					getterName)
{
	{
		const tcu::ScopedLogSection	section	(gl.getLog(), "QueryAll", "Query all");
		std::string					buf		(logLen + 2, 'X');

		buf[logLen + 1] = '\0';
		(gl.*getInfoLog)(object, logLen, DE_NULL, &buf[0]);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), getterName);

		if (logLen > 0 && buf[logLen-1] != '\0')
			result.fail("Return buffer was not INFO_LOG_LENGTH sized and null-terminated");
		else if (buf[logLen] != 'X' && buf[logLen+1] != '\0')
			result.fail("Buffer end guard modified, query wrote over the end of the buffer.");
	}

	{
		const tcu::ScopedLogSection section	(gl.getLog(), "QueryMore", "Query more");
		std::string					buf		(logLen + 4, 'X');
		int							written	= -1;

		buf[logLen + 3] = '\0';
		(gl.*getInfoLog)(object, logLen+2, &written, &buf[0]);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), getterName);

		if (written == -1)
			result.fail("'length' was not written to");
		else if (buf[written] != '\0')
			result.fail("Either length was incorrect or result was not null-terminated");
		else if (logLen != 0 && (written + 1) > logLen)
			result.fail("'length' characters + null terminator is larger than INFO_LOG_LENGTH");
		else if ((written + 1) < logLen)
			result.fail("'length' is not consistent with INFO_LOG_LENGTH");
		else if (buf[logLen+2] != 'X' && buf[logLen+3] != '\0')
			result.fail("Buffer end guard modified, query wrote over the end of the buffer.");
		else if (written != (int)strlen(&buf[0]))
			result.fail("'length' and written string length do not match");
	}

	if (logLen > 2)
	{
		const tcu::ScopedLogSection section	(gl.getLog(), "QueryLess", "Query less");
		std::string					buf		(logLen + 2, 'X');
		int							written	= -1;

		(gl.*getInfoLog)(object, 2, &written, &buf[0]);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), getterName);

		if (written == -1)
			result.fail("'length' was not written to");
		else if (written != 1)
			result.fail("Expected 'length' = 1");
		else if (buf[1] != '\0')
			result.fail("Expected null terminator at index 1");
	}

	if (logLen > 0)
	{
		const tcu::ScopedLogSection section	(gl.getLog(), "QueryOne", "Query one character");
		std::string					buf		(logLen + 2, 'X');
		int							written	= -1;

		(gl.*getInfoLog)(object, 1, &written, &buf[0]);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), getterName);

		if (written == -1)
			result.fail("'length' was not written to");
		else if (written != 0)
			result.fail("Expected 'length' = 0");
		else if (buf[0] != '\0')
			result.fail("Expected null terminator at index 0");
	}

	{
		const tcu::ScopedLogSection section	(gl.getLog(), "QueryNone", "Query to zero-sized buffer");
		std::string					buf		(logLen + 2, 'X');
		int							written	= -1;

		(gl.*getInfoLog)(object, 0, &written, &buf[0]);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), getterName);

		if (written == -1)
			result.fail("'length' was not written to");
		else if (written != 0)
			result.fail("Expected 'length' = 0");
		else if (buf[0] != 'X')
			result.fail("Unexpected buffer mutation at index 0");
	}
}